

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O1

void __thiscall Entity::Entity(Entity *this,int Hit)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  
  this->_vptr_Entity = (_func_int **)&PTR___cxa_pure_virtual_00113a30;
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,paVar1,paVar1->_M_local_buf + (this->name)._M_string_length);
  this->durability = Hit;
  return;
}

Assistant:

Entity::Entity(int Hit) : name(name), durability(Hit) {}